

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

uint __thiscall lsh::vector::operator*(vector *this,vector *v)

{
  pointer puVar1;
  uint uVar2;
  invalid_argument *this_00;
  ulong uVar3;
  uint uVar4;
  
  if (this->size_ == v->size_) {
    puVar1 = (this->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = 0;
    for (uVar3 = 0;
        ((ulong)((long)(this->components_).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar1) >> 2 & 0xffffffff) != uVar3
        ; uVar3 = uVar3 + 1) {
      uVar4 = (v->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar3] & puVar1[uVar3];
      uVar4 = uVar4 - (uVar4 >> 1 & 0x55555555);
      uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
      uVar2 = uVar2 + (((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18);
    }
    return uVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Invalid vector size");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

unsigned int vector::size() const {
    return this->size_;
  }